

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

HierarchicalReference * __thiscall
slang::BumpAllocator::emplace<slang::ast::HierarchicalReference,slang::ast::HierarchicalReference&>
          (BumpAllocator *this,HierarchicalReference *args)

{
  Expression *pEVar1;
  pointer pEVar2;
  size_t sVar3;
  HierarchicalReference *pHVar4;
  
  pHVar4 = (HierarchicalReference *)allocate(this,0x28,8);
  pEVar1 = args->expr;
  pEVar2 = (args->path)._M_ptr;
  sVar3 = (args->path)._M_extent._M_extent_value;
  pHVar4->target = args->target;
  pHVar4->expr = pEVar1;
  (pHVar4->path)._M_ptr = pEVar2;
  (pHVar4->path)._M_extent._M_extent_value = sVar3;
  pHVar4->upwardCount = args->upwardCount;
  return pHVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }